

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManSetPhase(Aig_Man_t *pAig)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Obj_t *pAVar8;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAig_local;
  
  pAVar6 = Aig_ManConst1(pAig);
  *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 | 8;
  for (local_1c = 0; iVar3 = Vec_PtrSize(pAig->vCis), local_1c < iVar3; local_1c = local_1c + 1) {
    pvVar7 = Vec_PtrEntry(pAig->vCis,local_1c);
    *(ulong *)((long)pvVar7 + 0x18) = *(ulong *)((long)pvVar7 + 0x18) & 0xfffffffffffffff7;
  }
  for (local_1c = 0; iVar3 = Vec_PtrSize(pAig->vObjs), local_1c < iVar3; local_1c = local_1c + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_1c);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 != 0)) {
      pAVar8 = Aig_ObjFanin0(pAVar6);
      uVar2 = *(ulong *)&pAVar8->field_0x18;
      uVar5 = Aig_ObjFaninC0(pAVar6);
      pAVar8 = Aig_ObjFanin1(pAVar6);
      uVar1 = *(ulong *)&pAVar8->field_0x18;
      uVar4 = Aig_ObjFaninC1(pAVar6);
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 |
           ((ulong)(((uint)(uVar2 >> 3) & 1 ^ uVar5) & ((uint)(uVar1 >> 3) & 1 ^ uVar4)) & 1) << 3;
    }
  }
  for (local_1c = 0; iVar3 = Vec_PtrSize(pAig->vCos), local_1c < iVar3; local_1c = local_1c + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_1c);
    pAVar8 = Aig_ObjFanin0(pAVar6);
    uVar2 = *(ulong *)&pAVar8->field_0x18;
    uVar5 = Aig_ObjFaninC0(pAVar6);
    *(ulong *)&pAVar6->field_0x18 =
         *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 |
         ((ulong)((uint)(uVar2 >> 3) & 1 ^ uVar5) & 1) << 3;
  }
  return;
}

Assistant:

void Aig_ManSetPhase( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i;
    // set the PI simulation information
    Aig_ManConst1( pAig )->fPhase = 1;
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->fPhase = 0;
    // simulate internal nodes
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->fPhase = ( Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj) )
                     & ( Aig_ObjFanin1(pObj)->fPhase ^ Aig_ObjFaninC1(pObj) );
    // simulate PO nodes
    Aig_ManForEachCo( pAig, pObj, i )
        pObj->fPhase = Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj);
}